

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O1

int Fxu_SelectSCD(Fxu_Matrix *p,int WeightLimit,Fxu_Var **ppVar1,Fxu_Var **ppVar2)

{
  Fxu_Var **ppFVar1;
  Fxu_Var *pFVar2;
  int iVar3;
  Fxu_Lit *pFVar4;
  Fxu_Var *pFVar5;
  Fxu_Lit *pFVar6;
  Fxu_Var *pFVar7;
  int iVar8;
  Fxu_Var *pVar1;
  
  pVar1 = (p->lVars).pHead;
  if (pVar1 == (Fxu_Var *)0x0) {
    iVar8 = -10;
  }
  else {
    ppFVar1 = &p->pOrderVars;
    iVar8 = -10;
    do {
      p->ppTailVars = ppFVar1;
      p->pOrderVars = (Fxu_Var *)0x0;
      for (pFVar4 = (pVar1->lLits).pHead; pFVar4 != (Fxu_Lit *)0x0; pFVar4 = pFVar4->pVNext) {
        for (pFVar6 = pFVar4->pHNext; pFVar6 != (Fxu_Lit *)0x0; pFVar6 = pFVar6->pHNext) {
          pFVar7 = pFVar6->pVar;
          if (pFVar7->pOrder == (Fxu_Var *)0x0) {
            *p->ppTailVars = pFVar7;
            p->ppTailVars = &pFVar7->pOrder;
            pFVar7->pOrder = (Fxu_Var *)0x1;
          }
        }
      }
      pFVar7 = *ppFVar1;
      if ((Fxu_Var *)0x1 < pFVar7) {
        do {
          iVar3 = Fxu_SingleCountCoincidence(p,pVar1,pFVar7);
          if (iVar3 < 1) {
            __assert_fail("Coin > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuSelect.c"
                          ,0x241,"int Fxu_SelectSCD(Fxu_Matrix *, int, Fxu_Var **, Fxu_Var **)");
          }
          if (iVar8 < iVar3 + -2) {
            *ppVar1 = pVar1;
            *ppVar2 = pFVar7;
            iVar8 = iVar3 + -2;
          }
          pFVar7 = pFVar7->pOrder;
        } while (pFVar7 != (Fxu_Var *)0x1);
      }
      pFVar7 = *ppFVar1;
      if ((pFVar7 != (Fxu_Var *)0x0) && (pFVar7 != (Fxu_Var *)0x1)) {
        pFVar2 = pFVar7->pOrder;
        while (pFVar5 = pFVar2, pFVar7->pOrder = (Fxu_Var *)0x0, pFVar5 != (Fxu_Var *)0x1) {
          pFVar7 = pFVar5;
          pFVar2 = pFVar5->pOrder;
        }
      }
      *ppFVar1 = (Fxu_Var *)0x0;
      p->ppTailVars = (Fxu_Var **)0x0;
      pVar1 = pVar1->pNext;
    } while (pVar1 != (Fxu_Var *)0x0);
  }
  return iVar8;
}

Assistant:

int Fxu_SelectSCD( Fxu_Matrix * p, int WeightLimit, Fxu_Var ** ppVar1, Fxu_Var ** ppVar2 )
{
//    int * pValue2Node = p->pValue2Node;
    Fxu_Var * pVar1;
    Fxu_Var * pVar2, * pVarTemp;
    Fxu_Lit * pLitV, * pLitH;
    int Coin;
    int CounterAll;
    int CounterTest;
    int WeightCur;
    int WeightBest;

    CounterAll = 0;
    CounterTest = 0;

    WeightBest = -10;
    
    // iterate through the columns in the matrix
    Fxu_MatrixForEachVariable( p, pVar1 )
    {
        // start collecting the affected vars
        Fxu_MatrixRingVarsStart( p );

        // go through all the literals of this variable
        for ( pLitV = pVar1->lLits.pHead; pLitV; pLitV = pLitV->pVNext )
        {
            // for this literal, go through all the horizontal literals
            for ( pLitH = pLitV->pHNext; pLitH; pLitH = pLitH->pHNext )
            {
                // get another variable
                pVar2 = pLitH->pVar;
                CounterAll++;
                // skip the var if it is already used
                if ( pVar2->pOrder )
                    continue;
                // skip the var if it belongs to the same node
//                if ( pValue2Node[pVar1->iVar] == pValue2Node[pVar2->iVar] )
//                    continue;
                // collect the var
                Fxu_MatrixRingVarsAdd( p, pVar2 );
            }
        }
        // stop collecting the selected vars
        Fxu_MatrixRingVarsStop( p );

        // iterate through the selected vars
        Fxu_MatrixForEachVarInRing( p, pVar2 )
        {
            CounterTest++;

            // count the coincidence
            Coin = Fxu_SingleCountCoincidence( p, pVar1, pVar2 );
            assert( Coin > 0 );

            // get the new weight
            WeightCur = Coin - 2;

            // compare the weights
            if ( WeightBest < WeightCur )
            {
                WeightBest = WeightCur;
                *ppVar1 = pVar1;
                *ppVar2 = pVar2;
            }
        }
        // unmark the vars
        Fxu_MatrixForEachVarInRingSafe( p, pVar2, pVarTemp )
            pVar2->pOrder = NULL;
        Fxu_MatrixRingVarsReset( p );
    }

//    if ( WeightBest == WeightLimit )
//        return -1;
    return WeightBest;
}